

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

iterator * __thiscall
google::
sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
::find<HashObject<256,32>>
          (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *this,HashObject<256,_32> *key)

{
  st_iterator it;
  st_iterator it_end;
  size_type sVar1;
  nonempty_iterator in_RSI;
  iterator *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> pos;
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_ffffffffffffff50;
  sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_ffffffffffffff70;
  HashObject<256,_32> *in_stack_ffffffffffffff78;
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_ffffffffffffff80;
  iterator *this_00;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  sVar1 = sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
          ::size(in_stack_ffffffffffffff50);
  if (sVar1 == 0) {
    sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::end(in_stack_ffffffffffffffe0);
  }
  else {
    pVar2 = find_position<HashObject<256,32>>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (pVar2.first == 0xffffffffffffffff) {
      sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::end((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
             *)0xffffffffffffffff);
    }
    else {
      sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::get_iter((sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                  *)this_00,(size_type)in_RDI);
      sparsetable<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::nonempty_end(in_stack_ffffffffffffff70);
      it.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_60;
      it.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_28;
      it.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_58;
      it.col_current = local_50;
      it_end.row_end._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)in_RDI;
      it_end.row_begin._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_48;
      it_end.row_current._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)this_00;
      it_end.col_current = in_RSI;
      sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::sparse_hashtable_iterator(local_38,local_40,it,it_end);
    }
  }
  return this_00;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table.get_iter(pos.first), table.nonempty_end());
  }